

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O2

bool __thiscall
nuraft::snapshot_io_mgr::has_pending_request(snapshot_io_mgr *this,raft_server *r,int srv_id)

{
  _List_node_base *p_Var1;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *plVar2;
  
  std::mutex::lock(&this->queue_lock_);
  plVar2 = &this->queue_;
  p_Var1 = (_List_node_base *)plVar2;
  do {
    p_Var1 = (((_List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)plVar2) break;
  } while ((*(raft_server **)p_Var1[1]._M_next != r) ||
          (*(int *)**(undefined8 **)((long)p_Var1[1]._M_next + 0x30) != srv_id));
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_lock_);
  return p_Var1 != (_List_node_base *)plVar2;
}

Assistant:

bool snapshot_io_mgr::has_pending_request(raft_server* r, int srv_id) {
    auto_lock(queue_lock_);
    for (auto& entry: queue_) {
        if ( entry->raft_.get() == r &&
             entry->dst_->get_id() == srv_id ) {
            return true;
        }
    }
    return false;
}